

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

HttpHeaderId __thiscall kj::HttpHeaderTable::Builder::add(Builder *this,StringPtr name)

{
  HttpHeaderTable *pHVar1;
  unordered_map<kj::StringPtr,unsigned_int,kj::(anonymous_namespace)::HeaderNameHash,kj::(anonymous_namespace)::HeaderNameHash,std::allocator<std::pair<kj::StringPtr_const,unsigned_int>>>
  *this_00;
  pointer ppVar2;
  __enable_if_t<is_constructible<value_type,_pair<StringPtr,_unsigned_long>_&&>::value,_pair<iterator,_bool>_>
  _Var3;
  HttpHeaderId HVar4;
  StringPtr name_00;
  size_t local_78;
  pair<kj::StringPtr,_unsigned_long> local_70;
  _Node_iterator_base<std::pair<const_kj::StringPtr,_unsigned_int>,_true> local_58;
  __enable_if_t<is_constructible<value_type,_pair<StringPtr,_unsigned_long>_&&>::value,_pair<iterator,_bool>_>
  insertResult;
  Builder *this_local;
  StringPtr name_local;
  undefined4 local_10;
  
  name_00.content.size_ = (char *)name.content.size_;
  insertResult._8_8_ = name.content.ptr;
  name_00.content.ptr = name_00.content.size_;
  this_local = (Builder *)insertResult._8_8_;
  name_local.content.ptr = name_00.content.size_;
  anon_unknown_36::requireValidHeaderName((anon_unknown_36 *)insertResult._8_8_,name_00);
  pHVar1 = Own<kj::HttpHeaderTable,_std::nullptr_t>::operator->(&this->table);
  this_00 = (unordered_map<kj::StringPtr,unsigned_int,kj::(anonymous_namespace)::HeaderNameHash,kj::(anonymous_namespace)::HeaderNameHash,std::allocator<std::pair<kj::StringPtr_const,unsigned_int>>>
             *)Own<kj::HttpHeaderTable::IdsByNameMap,_std::nullptr_t>::operator->
                         (&pHVar1->idsByName);
  pHVar1 = Own<kj::HttpHeaderTable,_std::nullptr_t>::operator->(&this->table);
  local_78 = Vector<kj::StringPtr>::size(&pHVar1->namesById);
  std::make_pair<kj::StringPtr&,unsigned_long>(&local_70,(StringPtr *)&this_local,&local_78);
  _Var3 = std::
          unordered_map<kj::StringPtr,unsigned_int,kj::(anonymous_namespace)::HeaderNameHash,kj::(anonymous_namespace)::HeaderNameHash,std::allocator<std::pair<kj::StringPtr_const,unsigned_int>>>
          ::insert<std::pair<kj::StringPtr,unsigned_long>>(this_00,&local_70);
  local_58._M_cur =
       (__node_type *)
       _Var3.first.super__Node_iterator_base<std::pair<const_kj::StringPtr,_unsigned_int>,_true>.
       _M_cur;
  insertResult.first.super__Node_iterator_base<std::pair<const_kj::StringPtr,_unsigned_int>,_true>.
  _M_cur._0_1_ = _Var3.second;
  if (((undefined1  [16])_Var3 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pHVar1 = Own<kj::HttpHeaderTable,_std::nullptr_t>::operator->(&this->table);
    Vector<kj::StringPtr>::add<kj::StringPtr&>(&pHVar1->namesById,(StringPtr *)&this_local);
  }
  pHVar1 = kj::Own::operator_cast_to_HttpHeaderTable_((Own *)this);
  ppVar2 = std::__detail::_Node_iterator<std::pair<const_kj::StringPtr,_unsigned_int>,_false,_true>
           ::operator->((_Node_iterator<std::pair<const_kj::StringPtr,_unsigned_int>,_false,_true> *
                        )&local_58);
  HttpHeaderId::HttpHeaderId((HttpHeaderId *)&name_local.content.size_,pHVar1,ppVar2->second);
  HVar4._12_4_ = 0;
  HVar4.table = (HttpHeaderTable *)name_local.content.size_;
  HVar4.id = local_10;
  return HVar4;
}

Assistant:

HttpHeaderId HttpHeaderTable::Builder::add(kj::StringPtr name) {
  requireValidHeaderName(name);

  auto insertResult = table->idsByName->map.insert(std::make_pair(name, table->namesById.size()));
  if (insertResult.second) {
    table->namesById.add(name);
  }
  return HttpHeaderId(table, insertResult.first->second);
}